

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat3 * dja::operator*(mat3 *__return_storage_ptr__,mat3 *a,mat3 *b)

{
  vec3 *pvVar1;
  int j;
  long lVar2;
  vec3 *b_00;
  int i;
  long lVar3;
  float_t fVar4;
  mat3 t;
  vec3 local_54 [3];
  
  transpose(b);
  mat3::mat3(__return_storage_ptr__,1.0);
  lVar2 = 0;
  pvVar1 = __return_storage_ptr__->m;
  for (; lVar2 != 3; lVar2 = lVar2 + 1) {
    b_00 = local_54;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      fVar4 = dot(a->m + lVar2,b_00);
      (&((vec3 *)&pvVar1->x)->x)[lVar3] = fVar4;
      b_00 = b_00 + 1;
    }
    pvVar1 = pvVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

mat3 operator*(const mat3& a, const mat3& b)
{
    mat3 t = transpose(b), r;

    for (int j = 0; j < 3; ++j)
    for (int i = 0; i < 3; ++i)
        r[j][i] = dot(a[j], t[i]);

    return r;
}